

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O3

void __thiscall QScrollArea::setWidget(QScrollArea *this,QWidget *widget)

{
  QPointer<QWidget> *pQVar1;
  QScrollAreaPrivate *this_00;
  QObject *pQVar2;
  bool bVar3;
  QWidget *pQVar4;
  Data *pDVar5;
  Data *pDVar6;
  QObject **ppQVar7;
  long in_FS_OFFSET;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar1 = &this_00->widget;
  pDVar6 = (this_00->widget).wp.d;
  if (pDVar6 == (Data *)0x0) {
    if (widget == (QWidget *)0x0) goto LAB_00471f96;
    (pQVar1->wp).d = (Data *)0x0;
    (this_00->widget).wp.value = (QObject *)0x0;
  }
  else {
    if (*(int *)(pDVar6 + 4) == 0) {
      pQVar4 = (QWidget *)0x0;
    }
    else {
      pQVar4 = (QWidget *)(this_00->widget).wp.value;
    }
    if ((widget == (QWidget *)0x0) || (pQVar4 == widget)) goto LAB_00471f96;
    if ((*(int *)(pDVar6 + 4) == 0) ||
       (pQVar2 = (this_00->widget).wp.value, pQVar2 == (QObject *)0x0)) {
      (pQVar1->wp).d = (Data *)0x0;
      (this_00->widget).wp.value = (QObject *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x20))(pQVar2);
      pDVar6 = (this_00->widget).wp.d;
      (pQVar1->wp).d = (Data *)0x0;
      (this_00->widget).wp.value = (QObject *)0x0;
      if (pDVar6 == (Data *)0x0) goto LAB_00471ec8;
    }
    LOCK();
    *(int *)pDVar6 = *(int *)pDVar6 + -1;
    UNLOCK();
    if (*(int *)pDVar6 == 0) {
      operator_delete(pDVar6);
    }
  }
LAB_00471ec8:
  ppQVar7 = &(this_00->widget).wp.value;
  QAbstractSlider::setValue
            (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
  QAbstractSlider::setValue
            (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
  pQVar4 = (this_00->super_QAbstractScrollAreaPrivate).viewport;
  if (*(QWidget **)(*(long *)&widget->field_0x8 + 0x10) != pQVar4) {
    QWidget::setParent(widget,pQVar4);
  }
  bVar3 = QWidget::testAttribute_helper(widget,WA_Resized);
  if (!bVar3) {
    local_38 = (QSize)(**(code **)(*(long *)widget + 0x70))(widget);
    QWidget::resize(widget,&local_38);
  }
  pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
  pDVar6 = (pQVar1->wp).d;
  (pQVar1->wp).d = pDVar5;
  *ppQVar7 = &widget->super_QObject;
  pQVar4 = widget;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar6 = *(int *)pDVar6 + -1;
    UNLOCK();
    if (*(int *)pDVar6 == 0) {
      operator_delete(pDVar6);
    }
    pQVar4 = (QWidget *)*ppQVar7;
  }
  QWidget::setAutoFillBackground(pQVar4,true);
  QObject::installEventFilter(&widget->super_QObject);
  (this_00->widgetSize).wd = -1;
  (this_00->widgetSize).ht = -1;
  QScrollAreaPrivate::updateScrollBars(this_00);
  QWidget::show((QWidget *)(this_00->widget).wp.value);
LAB_00471f96:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollArea::setWidget(QWidget *widget)
{
    Q_D(QScrollArea);
    if (widget == d->widget || !widget)
        return;

    delete d->widget;
    d->widget = nullptr;
    d->hbar->setValue(0);
    d->vbar->setValue(0);
    if (widget->parentWidget() != d->viewport)
        widget->setParent(d->viewport);
    if (!widget->testAttribute(Qt::WA_Resized))
        widget->resize(widget->sizeHint());
    d->widget = widget;
    d->widget->setAutoFillBackground(true);
    widget->installEventFilter(this);
    d->widgetSize = QSize();
    d->updateScrollBars();
    d->widget->show();

}